

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# length_prefixed_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1172e9::LengthPrefixedTest_AFewMessages_Test::
~LengthPrefixedTest_AFewMessages_Test(LengthPrefixedTest_AFewMessages_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(LengthPrefixedTest, AFewMessages) {
  upb_Arena* arena = upb_Arena_New();
  protobuf_test_messages_proto2_TestAllTypesProto2* a =
      protobuf_test_messages_proto2_TestAllTypesProto2_new(arena);
  protobuf_test_messages_proto2_TestAllTypesProto2* b =
      protobuf_test_messages_proto2_TestAllTypesProto2_new(arena);
  protobuf_test_messages_proto2_TestAllTypesProto2* c =
      protobuf_test_messages_proto2_TestAllTypesProto2_new(arena);

  protobuf_test_messages_proto2_TestAllTypesProto2_set_optional_bool(a, true);
  protobuf_test_messages_proto2_TestAllTypesProto2_set_optional_int32(b, 1);
  protobuf_test_messages_proto2_TestAllTypesProto2_set_oneof_string(
      c, upb_StringView_FromString("string"));

  TestEncodeDecodeRoundTrip(arena, {a, b, c});
  upb_Arena_Free(arena);
}